

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseResidencyInstance *this)

{
  DeviceDriver *vk;
  VkDevice device;
  ProgramCollection<vk::ProgramBinary> *this_00;
  void *pvVar1;
  deUint32 memoryType;
  VkResult result;
  int iVar2;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar3;
  DescriptorSetLayoutBuilder *pDVar4;
  ProgramBinary *binary;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *pDVar5;
  NotSupportedError *pNVar6;
  deUint32 valueNdx;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint local_790;
  RefBase<vk::VkCommandBuffer_s_*> local_788;
  Queue *local_760;
  Queue *local_758;
  deUint32 queueFamilyIndices [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_728;
  string local_708;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  VkDescriptorBufferInfo sparseBufferInfo;
  QueueRequirementsVec queueRequirements;
  VkBool32 local_5f4;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_5c8;
  VkMemoryRequirements bufferMemRequirements;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_588;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_568;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_548;
  VkBufferCreateInfo bufferCreateInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkPipelineStageFlags waitStageBits [1];
  undefined4 uStack_4cc;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_4b8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_498;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_458;
  VkBufferCreateInfo inputBufferCreateInfo;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3f8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_3d8;
  VkBufferCreateInfo outputBufferCreateInfo;
  Location local_378;
  Location local_370;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties(&physicalDeviceProperties,vk_00,physicalDevice);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)&queueRequirements,vk_00,physicalDevice);
  if (local_5f4 == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Sparse partially resident buffers not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0x90);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            (&queueRequirements,(QueueRequirements *)&bufferCreateInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            (&queueRequirements,(QueueRequirements *)&bufferCreateInfo);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,&queueRequirements);
  std::_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ::~_Vector_base(&queueRequirements.
                   super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                 );
  vk = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pQVar3 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  local_758 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 3;
  bufferCreateInfo.size = (VkDeviceSize)this->m_bufferSize;
  bufferCreateInfo.usage = 0x21;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  queueFamilyIndices[0] = pQVar3->queueFamilyIndex;
  queueFamilyIndices[1] = local_758->queueFamilyIndex;
  if (queueFamilyIndices[0] != queueFamilyIndices[1]) {
    bufferCreateInfo.queueFamilyIndexCount = 2;
    bufferCreateInfo.pQueueFamilyIndices = queueFamilyIndices;
  }
  bufferCreateInfo.sharingMode = (VkSharingMode)(queueFamilyIndices[0] != queueFamilyIndices[1]);
  local_760 = pQVar3;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                     &vk->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_5c8.m_data.deleter.m_device =
       (VkDevice)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5c8.m_data.object.m_internal =
       (deUint64)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5c8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&queueRequirements,&vk->super_DeviceInterface,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  local_478.m_data.deleter.m_device =
       (VkDevice)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_478.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_478.m_data.object.m_internal =
       (deUint64)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&queueRequirements);
  ::vk::getBufferMemoryRequirements
            (&bufferMemRequirements,&vk->super_DeviceInterface,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkBuffer)local_5c8.m_data.object.m_internal);
  if (physicalDeviceProperties.limits.sparseAddressSpaceSize < bufferMemRequirements.size) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Required memory size for sparse resources exceeds device limits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0xbf);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar7 = CONCAT44(bufferMemRequirements.alignment._4_4_,(uint)bufferMemRequirements.alignment);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  memoryType = findMatchingMemoryType
                         (vk_00,physicalDevice,&bufferMemRequirements,
                          (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  local_790 = (uint)(bufferMemRequirements.size / uVar7);
  if (memoryType == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&queueRequirements,"No matching memory type found",
               (allocator<char> *)&outputBufferCreateInfo);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&queueRequirements);
    std::__cxx11::string::~string((string *)&queueRequirements);
  }
  else {
    for (uVar10 = 0; uVar10 < local_790; uVar10 = uVar10 + 2) {
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)&queueRequirements,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 CONCAT44(bufferMemRequirements.alignment._4_4_,
                          (uint)bufferMemRequirements.alignment),memoryType,
                 (ulong)uVar10 *
                 CONCAT44(bufferMemRequirements.alignment._4_4_,
                          (uint)bufferMemRequirements.alignment));
      local_458.m_data.object.m_internal =
           (deUint64)
           ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                     ((Handle<(vk::HandleType)7>)
                      queueRequirements.
                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_458.m_data.deleter.m_device =
           (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
           .m_data.object;
      local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_458.m_data.deleter.m_deviceIface = &vk->super_DeviceInterface;
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                ((sparse *)&outputBufferCreateInfo,
                 (Move<vk::Handle<(vk::HandleType)7>_> *)&local_458);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                  *)&deviceMemUniquePtrVec,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                 &outputBufferCreateInfo);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                 &outputBufferCreateInfo);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_458);
      std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                 &inputBufferCreateInfo,(VkSparseMemoryBind *)&queueRequirements);
    }
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(queueRequirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,7);
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)queueRequirements.
                          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    outputBufferCreateInfo._0_8_ = local_5c8.m_data.object.m_internal;
    outputBufferCreateInfo.pNext._0_4_ =
         (undefined4)(((long)inputBufferCreateInfo.pNext - inputBufferCreateInfo._0_8_) / 0x28);
    outputBufferCreateInfo.flags = inputBufferCreateInfo.sType;
    outputBufferCreateInfo._20_4_ = inputBufferCreateInfo._4_4_;
    result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])(vk,local_760->queueHandle);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
                      ,0xe8);
  }
  std::_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~_Vector_base
            ((_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
             &inputBufferCreateInfo);
  if (memoryType != 0xffffffff) {
    makeBufferCreateInfo(&inputBufferCreateInfo,(ulong)this->m_bufferSize,0x20);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                       &vk->super_DeviceInterface,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                       (VkAllocationCallbacks *)0x0);
    local_548.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_548.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_548.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_548.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements);
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements,
               &vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseResourcesBaseInstance).m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               (VkBuffer)local_548.m_data.object.m_internal,(MemoryRequirement)0x1);
    inputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    ptr = (Allocation *)
          queueRequirements.
          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements
              );
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&referenceData,(ulong)this->m_bufferSize);
    for (uVar7 = 0; uVar7 < this->m_bufferSize; uVar7 = uVar7 + 1) {
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] =
           (char)(uVar7 % CONCAT44(bufferMemRequirements.alignment._4_4_,
                                   (uint)bufferMemRequirements.alignment)) + '\x01';
    }
    memcpy((inputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr)->m_hostPtr,
           referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,(ulong)this->m_bufferSize);
    ::vk::flushMappedMemoryRange
              (&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkDeviceMemory)
               ((inputBufferAlloc.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,(ulong)this->m_bufferSize);
    makeBufferCreateInfo(&outputBufferCreateInfo,(ulong)this->m_bufferSize,2);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                       &vk->super_DeviceInterface,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                       (VkAllocationCallbacks *)0x0);
    local_568.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_568.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_568.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_568.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements);
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements,
               &vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseResourcesBaseInstance).m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               (VkBuffer)local_568.m_data.object.m_internal,(MemoryRequirement)0x1);
    outputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    ptr = (Allocation *)
          queueRequirements.
          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements
              );
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&queueRequirements,
                    &vk->super_DeviceInterface,
                    (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                    super_RefBase<vk::VkDevice_s_*>.m_data.object,local_758->queueFamilyIndex);
    local_3d8.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_3d8.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3d8.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&queueRequirements);
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&queueRequirements,&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkCommandPool)local_3d8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    local_788.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_788.m_data.deleter.m_pool.m_internal = 0;
    local_788.m_data.object =
         (VkCommandBuffer_s *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_788.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)&queueRequirements);
    beginCommandBuffer(&vk->super_DeviceInterface,local_788.m_data.object);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&queueRequirements);
    pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                       ((DescriptorSetLayoutBuilder *)&queueRequirements,
                        VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
    pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                       (pDVar4,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
    ::vk::DescriptorSetLayoutBuilder::build
              ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_588,pDVar4,&vk->super_DeviceInterface
               ,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
    local_498.m_data.deleter.m_device = local_588.m_data.deleter.m_device;
    local_498.m_data.deleter.m_allocator = local_588.m_data.deleter.m_allocator;
    local_498.m_data.object.m_internal = local_588.m_data.object.m_internal;
    local_498.m_data.deleter.m_deviceIface = local_588.m_data.deleter.m_deviceIface;
    local_588.m_data.object.m_internal = 0;
    local_588.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_588.m_data.deleter.m_device = (VkDevice)0x0;
    local_588.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_588);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&queueRequirements);
    device = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object;
    this_00 = ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
              m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"comp",(allocator<char> *)&local_4b8);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_708);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&queueRequirements,
               &vk->super_DeviceInterface,device,binary,0);
    local_588.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_588.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_588.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_588.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&queueRequirements);
    std::__cxx11::string::~string((string *)&local_708);
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&queueRequirements,
                       &vk->super_DeviceInterface,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,
                       (VkDescriptorSetLayout)local_498.m_data.object.m_internal);
    local_708.field_2._M_allocated_capacity =
         (size_type)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_708.field_2._8_8_ = 0;
    local_708._M_dataplus._M_p =
         (pointer)queueRequirements.
                  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_708._M_string_length =
         (size_type)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&queueRequirements);
    makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&queueRequirements,
                        &vk->super_DeviceInterface,
                        (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,
                        (VkPipelineLayout)local_708._M_dataplus._M_p,
                        (VkShaderModule)local_588.m_data.object.m_internal,
                        (VkSpecializationInfo *)0x0);
    local_4b8.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_4b8.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_4b8.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&queueRequirements);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
              (vk,local_788.m_data.object,1,local_4b8.m_data.object.m_internal);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_728);
    this_01 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)&local_728,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&queueRequirements,this_01,
               &vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
    local_3f8.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_3f8.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3f8.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&queueRequirements);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   *)&local_728);
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&queueRequirements,
                      &vk->super_DeviceInterface,
                      (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      (VkDescriptorPool)local_3f8.m_data.object.m_internal,
                      (VkDescriptorSetLayout)local_498.m_data.object.m_internal);
    local_728.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_728.m_data.deleter.m_pool.m_internal = 0;
    local_728.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_728.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&queueRequirements);
    sparseBufferInfo.range = (VkDeviceSize)this->m_bufferSize;
    _waitStageBits = local_548.m_data.object.m_internal;
    sparseBufferInfo.buffer.m_internal = local_5c8.m_data.object.m_internal;
    sparseBufferInfo.offset = 0;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&queueRequirements);
    local_370.m_binding = 0;
    local_370.m_arrayElement = 0;
    pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       ((DescriptorSetUpdateBuilder *)&queueRequirements,
                        (VkDescriptorSet)local_728.m_data.object.m_internal,&local_370,
                        VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(VkDescriptorBufferInfo *)waitStageBits);
    local_378.m_binding = 1;
    local_378.m_arrayElement = 0;
    pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       (pDVar5,(VkDescriptorSet)local_728.m_data.object.m_internal,&local_378,
                        VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&sparseBufferInfo);
    ::vk::DescriptorSetUpdateBuilder::update
              (pDVar5,&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&queueRequirements);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x56])
              (vk,local_788.m_data.object,1,local_708._M_dataplus._M_p,0,1,&local_728,0,0);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x4000,0x20,
               (VkBuffer)local_548.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
              (vk,local_788.m_data.object,0x4000,0x800,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5d])(vk,local_788.m_data.object,1);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x40,0x800,
               (VkBuffer)local_5c8.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
              (vk,local_788.m_data.object,0x800,0x1000,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)this->m_bufferSize;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
              (vk,local_788.m_data.object,local_5c8.m_data.object.m_internal,
               local_568.m_data.object.m_internal);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x1000,0x2000,
               (VkBuffer)local_568.m_data.object.m_internal,0,(ulong)this->m_bufferSize);
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
              (vk,local_788.m_data.object,0x1000,0x4000,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    endCommandBuffer(&vk->super_DeviceInterface,local_788.m_data.object);
    waitStageBits[0] = 0x1000;
    submitCommandsAndWait
              (&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,local_758->queueHandle,
               local_788.m_data.object,1,(VkSemaphore *)&local_478,waitStageBits,0,
               (VkSemaphore *)0x0);
    ::vk::invalidateMappedMemoryRange
              (&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkDeviceMemory)
               ((outputBufferAlloc.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,(ulong)this->m_bufferSize);
    pvVar1 = (outputBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    (*(vk->super_DeviceInterface)._vptr_DeviceInterface[3])(vk);
    for (uVar10 = 0; uVar10 < local_790; uVar10 = uVar10 + 1) {
      uVar8 = (uint)bufferMemRequirements.alignment;
      if (local_790 - 1 == uVar10) {
        uVar8 = this->m_bufferSize % (uint)bufferMemRequirements.alignment;
      }
      uVar9 = (ulong)((uint)bufferMemRequirements.alignment * uVar10);
      uVar7 = (ulong)uVar8;
      if ((uVar10 & 1) == 0) {
        iVar2 = bcmp(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9,
                     (void *)((long)pvVar1 + uVar9),uVar7);
        if (iVar2 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&queueRequirements,"Failed",(allocator<char> *)&sparseBufferInfo);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&queueRequirements);
          goto LAB_006ed606;
        }
      }
      else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict != 0) {
        memset(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar9,0,uVar7);
        iVar2 = bcmp(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9,
                     (void *)((long)pvVar1 + uVar9),uVar7);
        if (iVar2 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&queueRequirements,"Failed",(allocator<char> *)&sparseBufferInfo);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&queueRequirements);
          goto LAB_006ed606;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&queueRequirements,"Passed",(allocator<char> *)&sparseBufferInfo);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&queueRequirements);
LAB_006ed606:
    std::__cxx11::string::~string((string *)&queueRequirements);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_728);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3f8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_4b8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_708);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_588);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_498);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_788);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_3d8);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_568);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_548);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector(&deviceMemUniquePtrVec);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_5c8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&		 instance					= m_context.getInstanceInterface();
	const VkPhysicalDevice			 physicalDevice				= m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties physicalDeviceProperties	= getPhysicalDeviceProperties(instance, physicalDevice);

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse partially resident buffers not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
		VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,	// VkBufferCreateFlags	flags;
		m_bufferSize,							// VkDeviceSize			size;
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT |
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,		// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		0u,										// deUint32				queueFamilyIndexCount;
		DE_NULL									// const deUint32*		pQueueFamilyIndices;
	};

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirements = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirements.size % bufferMemRequirements.alignment) == 0);

	const deUint32				numSparseSlots = static_cast<deUint32>(bufferMemRequirements.size / bufferMemRequirements.alignment);
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>		sparseMemoryBinds;
		const deUint32						memoryType		= findMatchingMemoryType(instance, physicalDevice, bufferMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; sparseBindNdx += 2)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirements.alignment, memoryType, bufferMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, static_cast<deUint32>(sparseMemoryBinds.size()), &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create input buffer
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));


	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	// Create output buffer
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	// Create command buffer for compute and data transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording compute and transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	{
		const VkDescriptorBufferInfo inputBufferInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, m_bufferSize);
		const VkDescriptorBufferInfo sparseBufferInfo = makeDescriptorBufferInfo(*sparseBuffer, 0ull, m_bufferSize);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &inputBufferInfo)
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &sparseBufferInfo)
			.update(deviceInterface, getDevice());
	}

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_SHADER_READ_BIT,
										*inputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	deviceInterface.cmdDispatch(*commandBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_SHADER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording compute and transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; ++sparseBindNdx)
	{
		const deUint32 alignment = static_cast<deUint32>(bufferMemRequirements.alignment);
		const deUint32 offset	 = alignment * sparseBindNdx;
		const deUint32 size		 = sparseBindNdx == (numSparseSlots - 1) ? m_bufferSize % alignment : alignment;

		if (sparseBindNdx % 2u == 0u)
		{
			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
		else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
		{
			deMemset(&referenceData[offset], 0u, size);

			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}